

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_statements.cpp
# Opt level: O2

RsRuleSyntax * __thiscall slang::parsing::Parser::parseRsRule(Parser *this)

{
  bool bVar1;
  int iVar2;
  ExpressionSyntax *pEVar3;
  ParenthesizedExpressionSyntax *expr;
  RandJoinClauseSyntax *randJoin;
  RsProdSyntax *pRVar4;
  reference ppRVar5;
  RsCodeBlockSyntax *codeBlock;
  RsWeightClauseSyntax *weightClause;
  undefined4 extraout_var;
  RsRuleSyntax *pRVar6;
  SourceLocation SVar7;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *src;
  Token TVar8;
  Token join;
  Token openParen;
  Token closeParen;
  SourceRange SVar9;
  SourceRange SVar10;
  SmallVector<slang::syntax::RsProdSyntax_*,_5UL> prods;
  RsProdSyntax *prod;
  SyntaxNode *local_58;
  SyntaxKind local_50;
  pointer local_40;
  
  bVar1 = ParserBase::peek(&this->super_ParserBase,RandKeyword);
  if (bVar1) {
    TVar8 = ParserBase::consume(&this->super_ParserBase);
    join = ParserBase::expect(&this->super_ParserBase,JoinKeyword);
    bVar1 = ParserBase::peek(&this->super_ParserBase,OpenParenthesis);
    if (bVar1) {
      openParen = ParserBase::consume(&this->super_ParserBase);
      pEVar3 = parseExpression(this);
      closeParen = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
      expr = slang::syntax::SyntaxFactory::parenthesizedExpression
                       (&this->factory,openParen,pEVar3,closeParen);
    }
    else {
      expr = (ParenthesizedExpressionSyntax *)0x0;
    }
    randJoin = slang::syntax::SyntaxFactory::randJoinClause(&this->factory,TVar8,join,expr);
  }
  else {
    randJoin = (RandJoinClauseSyntax *)0x0;
  }
  prods.super_SmallVectorBase<slang::syntax::RsProdSyntax_*>.data_ =
       (pointer)prods.super_SmallVectorBase<slang::syntax::RsProdSyntax_*>.firstElement;
  prods.super_SmallVectorBase<slang::syntax::RsProdSyntax_*>.len = 0;
  prods.super_SmallVectorBase<slang::syntax::RsProdSyntax_*>.cap = 5;
  while( true ) {
    pRVar4 = parseRsProd(this);
    prod = pRVar4;
    if (pRVar4 == (RsProdSyntax *)0x0) break;
    SmallVectorBase<slang::syntax::RsProdSyntax*>::emplace_back<slang::syntax::RsProdSyntax*const&>
              ((SmallVectorBase<slang::syntax::RsProdSyntax*> *)&prods,&prod);
    if ((randJoin != (RandJoinClauseSyntax *)0x0) && ((prod->super_SyntaxNode).kind != RsProdItem))
    {
      SVar9 = slang::syntax::SyntaxNode::sourceRange(&prod->super_SyntaxNode);
      ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x800005,SVar9);
    }
  }
  if ((randJoin != (RandJoinClauseSyntax *)0x0) &&
     (prods.super_SmallVectorBase<slang::syntax::RsProdSyntax_*>.len < 2)) {
    SVar9 = slang::syntax::SyntaxNode::sourceRange(&randJoin->super_SyntaxNode);
    SVar7 = SVar9.endLoc;
    if (prods.super_SmallVectorBase<slang::syntax::RsProdSyntax_*>.len != 0) {
      ppRVar5 = SmallVectorBase<slang::syntax::RsProdSyntax_*>::back
                          (&prods.super_SmallVectorBase<slang::syntax::RsProdSyntax_*>);
      _prod = slang::syntax::SyntaxNode::getLastToken(&(*ppRVar5)->super_SyntaxNode);
      SVar10 = Token::range((Token *)&prod);
      SVar7 = SVar10.endLoc;
    }
    SVar10.endLoc = SVar7;
    SVar10.startLoc = SVar9.startLoc;
    ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x7f0005,SVar10);
  }
  bVar1 = ParserBase::peek(&this->super_ParserBase,ColonEquals);
  if (bVar1) {
    TVar8 = ParserBase::consume(&this->super_ParserBase);
    pEVar3 = parsePrimaryExpression(this,(bitmask<slang::parsing::detail::ExpressionOptions>)0x20);
    bVar1 = ParserBase::peek(&this->super_ParserBase,OpenBrace);
    if (bVar1) {
      codeBlock = parseRsCodeBlock(this);
    }
    else {
      codeBlock = (RsCodeBlockSyntax *)0x0;
    }
    weightClause = slang::syntax::SyntaxFactory::rsWeightClause
                             (&this->factory,TVar8,pEVar3,&codeBlock->super_RsProdSyntax);
    src = extraout_RDX_00;
  }
  else {
    weightClause = (RsWeightClauseSyntax *)0x0;
    src = extraout_RDX;
  }
  iVar2 = SmallVectorBase<slang::syntax::RsProdSyntax_*>::copy
                    (&prods.super_SmallVectorBase<slang::syntax::RsProdSyntax_*>,
                     (EVP_PKEY_CTX *)(this->super_ParserBase).alloc,src);
  local_40 = (pointer)CONCAT44(extraout_var,iVar2);
  local_50 = SyntaxList;
  _prod = (Token)ZEXT816(0x473bf0);
  pRVar6 = slang::syntax::SyntaxFactory::rsRule
                     (&this->factory,randJoin,(SyntaxList<slang::syntax::RsProdSyntax> *)&prod,
                      weightClause);
  SmallVectorBase<slang::syntax::RsProdSyntax_*>::~SmallVectorBase
            (&prods.super_SmallVectorBase<slang::syntax::RsProdSyntax_*>);
  return pRVar6;
}

Assistant:

RsRuleSyntax& Parser::parseRsRule() {
    RandJoinClauseSyntax* randJoin = nullptr;
    if (peek(TokenKind::RandKeyword)) {
        auto rand = consume();
        auto join = expect(TokenKind::JoinKeyword);

        ParenthesizedExpressionSyntax* parenExpr = nullptr;
        if (peek(TokenKind::OpenParenthesis)) {
            auto openParen = consume();
            auto& expr = parseExpression();
            auto closeParen = expect(TokenKind::CloseParenthesis);
            parenExpr = &factory.parenthesizedExpression(openParen, expr, closeParen);
        }

        randJoin = &factory.randJoinClause(rand, join, parenExpr);
    }

    SmallVector<RsProdSyntax*> prods;
    while (true) {
        auto prod = parseRsProd();
        if (!prod)
            break;

        prods.push_back(prod);
        if (randJoin && prod->kind != SyntaxKind::RsProdItem)
            addDiag(diag::RandJoinProdItem, prod->sourceRange());
    }

    if (randJoin && prods.size() < 2) {
        SourceRange range = randJoin->sourceRange();
        if (!prods.empty())
            range = SourceRange{range.start(), prods.back()->getLastToken().range().end()};

        addDiag(diag::RandJoinNotEnough, range);
    }

    RsWeightClauseSyntax* weightClause = nullptr;
    if (peek(TokenKind::ColonEquals)) {
        auto colonEqual = consume();
        auto& weight = parsePrimaryExpression(ExpressionOptions::DisallowVectors);

        RsCodeBlockSyntax* codeBlock = nullptr;
        if (peek(TokenKind::OpenBrace))
            codeBlock = &parseRsCodeBlock();

        weightClause = &factory.rsWeightClause(colonEqual, weight, codeBlock);
    }

    return factory.rsRule(randJoin, prods.copy(alloc), weightClause);
}